

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
::_reduce_by_G(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>
               *this,Tmp_column *column,
              vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *chainsInH,Index currentIndex)

{
  pointer pIVar1;
  ID_index IVar2;
  uint uVar3;
  Characteristic CVar4;
  pointer pIVar5;
  Column_settings *pCVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  iterator __position;
  Column_support *pCVar10;
  long *plVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar12;
  Field_element coef;
  uint local_50;
  uint local_4c;
  pointer local_48;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *local_40;
  Index local_34;
  
  pIVar5 = (this->matrix_).
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_barcode_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = pIVar5 + currentIndex;
  IVar2 = pIVar5[currentIndex].super_Chain_column_option.pivot_;
  if (IVar2 == 0xffffffff) {
LAB_0011ff6d:
    uVar7 = 0;
  }
  else {
    pCVar10 = &pIVar1->column_;
    do {
      pCVar10 = *(Column_support **)&(pCVar10->super_type).data_.root_plus_size_;
      if (pCVar10 == &pIVar1->column_) goto LAB_0011ff6d;
    } while (*(ID_index *)(pCVar10 + 1) != IVar2);
    uVar7 = *(uint *)((long)(pCVar10 + -1) + 0xc);
  }
  pCVar6 = this->colSettings_;
  uVar3 = (pCVar6->operators).characteristic_;
  if (uVar3 <= uVar7) {
    uVar7 = uVar7 % uVar3;
  }
  local_50 = (pCVar6->operators).inverse_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7];
  CVar4 = (pCVar6->operators).characteristic_;
  local_40 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)chainsInH;
  lVar9 = std::_Rb_tree_decrement(&(column->_M_t)._M_impl.super__Rb_tree_header._M_header);
  persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
            (&pCVar6->operators,&local_50,CVar4 - *(int *)(lVar9 + 0x24));
  uVar7 = local_50;
  plVar11 = *(long **)&(pIVar1->column_).super_type.data_.root_plus_size_;
  local_48 = pIVar1;
  if ((Column_support *)plVar11 != &pIVar1->column_) {
    pCVar6 = this->colSettings_;
    do {
      local_4c = *(uint *)(plVar11 + 2);
      pVar12 = std::
               _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
               ::_M_emplace_unique<unsigned_int,unsigned_int_const&>
                         ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                           *)column,&local_4c,(uint *)((long)plVar11 + -4));
      __position._M_node = (_Base_ptr)pVar12.first._M_node;
      if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        uVar8 = *(uint *)((long)plVar11 + -4) * uVar7 + *(int *)&__position._M_node[1].field_0x4;
        uVar3 = (pCVar6->operators).characteristic_;
        if (uVar3 <= uVar8) {
          uVar8 = uVar8 % uVar3;
        }
        *(uint *)&__position._M_node[1].field_0x4 = uVar8;
        if (uVar8 == 0) {
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                              *)column,__position);
        }
      }
      else {
        persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                  (&pCVar6->operators,(Element *)&__position._M_node[1].field_0x4,uVar7);
      }
      plVar11 = (long *)*plVar11;
    } while ((Column_support *)plVar11 != &pIVar1->column_);
  }
  local_34 = (local_48->super_Chain_column_option).pairedColumn_;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<unsigned_int,unsigned_int&>(local_40,&local_34,&local_50);
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_reduce_by_G(Tmp_column& column,
                                                      std::vector<Entry_representative>& chainsInH,
                                                      Index currentIndex)
{
  Column& col = get_column(currentIndex);
  if constexpr (Master_matrix::Option_list::is_z2) {
    _add_to(col, column, 1u);                           // Reduce with the column col_g
    chainsInH.push_back(col.get_paired_chain_index());  // keep the col_h with which col_g is paired
  } else {
    Field_element coef = col.get_pivot_value();
    auto& operators = colSettings_->operators;
    coef = operators.get_inverse(coef);
    operators.multiply_inplace(coef, operators.get_characteristic() - column.rbegin()->second);

    _add_to(col, column, coef);                                       // Reduce with the column col_g
    chainsInH.emplace_back(col.get_paired_chain_index(), coef); // keep the col_h with which col_g is paired
  }
}